

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::timestamp_t>
               (AggregateFunctionSet *fun,LogicalType *type)

{
  LogicalType *in_RCX;
  pointer this;
  vector<duckdb::LogicalType,_true> by_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_178;
  AggregateFunction local_160;
  
  ArgMaxByTypes();
  if (local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::timestamp_t>
                (&local_160,(duckdb *)this,type,in_RCX);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_160);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_02477a08;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      this = this + 1;
    } while (this != local_178.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_178);
  return;
}

Assistant:

void AddArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &type) {
	auto by_types = ArgMaxByTypes();
	for (const auto &by_type : by_types) {
#ifndef DUCKDB_SMALLER_BINARY
		fun.AddFunction(GetArgMinMaxFunctionBy<OP, ARG_TYPE>(by_type, type));
#else
		fun.AddFunction(GetArgMinMaxFunctionInternal<OP, string_t, string_t>(by_type, type));
#endif
	}
}